

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws_map.c
# Opt level: O1

lws_map_item_t *
lws_map_item_create(lws_map_t *map,lws_map_key_t key,size_t keylen,lws_map_value_t value,
                   size_t valuelen)

{
  lws_dll2_owner *plVar1;
  lws_map_hash_t lVar2;
  lws_map_item_t *plVar3;
  
  plVar3 = lws_map_item_lookup(map,key,keylen);
  if (plVar3 != (lws_map_item_t *)0x0) {
    plVar1 = (plVar3->list).owner;
    lws_dll2_remove(&plVar3->list);
    (**(code **)(*(long *)&plVar1[-1].count + 0x18))(plVar3);
  }
  plVar3 = (lws_map_item_t *)(*(map->info)._alloc)(map,keylen + valuelen + 0x28);
  if (plVar3 == (lws_map_item_t *)0x0) {
    plVar3 = (lws_map_item_t *)0x0;
  }
  else {
    lws_dll2_clear((lws_dll2 *)plVar3);
    plVar3->keylen = keylen;
    plVar3->valuelen = valuelen;
    memcpy(plVar3 + 1,key,keylen);
    if (value != (lws_map_value_t)0x0) {
      memcpy((void *)((long)&plVar3[1].list.prev + keylen),value,valuelen);
    }
    lVar2 = (*(map->info)._hash)(key,keylen);
    lws_dll2_add_head((lws_dll2 *)plVar3,
                      (lws_dll2_owner *)
                      (&map[1].info._compare + ((ulong)lVar2 % (map->info).modulo) * 4));
  }
  return plVar3;
}

Assistant:

lws_map_item_t *
lws_map_item_create(lws_map_t *map,
		    const lws_map_key_t key, size_t keylen,
		    const lws_map_value_t value, size_t valuelen)
{
	lws_map_hashtable_t *ht;
	lws_map_item_t *item;
	lws_map_hash_t h;
	size_t hti;
	uint8_t *u;

	item = lws_map_item_lookup(map, key, keylen);
	if (item)
		lws_map_item_destroy(item);

	item = map->info._alloc(map, sizeof(*item) + keylen + valuelen);
	if (!item)
		return NULL;

	lws_dll2_clear(&item->list);
	item->keylen = keylen;
	item->valuelen = valuelen;

	u = (uint8_t *)&item[1];
	memcpy(u, key, keylen);
	u += keylen;
	if (value)
		memcpy(u, value, valuelen);

	h = map->info._hash(key, keylen);

	hti = h % map->info.modulo;
	ht = (lws_map_hashtable_t *)&map[1];

	lws_dll2_add_head(&item->list, &ht[hti].ho);

	return item;
}